

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::anon_unknown_11::Optimizer::MergeBranchInto(Optimizer *this,Branch *Curr,Branch *Into)

{
  bool bVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer pvVar2;
  Binary *pBVar3;
  Builder local_50;
  uint *local_48;
  uint *local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  const_iterator local_28;
  Branch *local_20;
  Branch *Into_local;
  Branch *Curr_local;
  Optimizer *this_local;
  
  local_20 = Into;
  Into_local = Curr;
  Curr_local = (Branch *)this;
  if (Curr == Into) {
    __assert_fail("Curr != Into",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                  ,0x3cc,
                  "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)")
    ;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&Curr->SwitchValues);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20->SwitchValues);
    if (bVar1) {
      this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                std::
                unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator->(&local_20->SwitchValues);
      pvVar2 = std::
               unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator->(&local_20->SwitchValues);
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
      __gnu_cxx::
      __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
      ::__normal_iterator<unsigned_int*>
                ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  *)&local_28,&local_30);
      pvVar2 = std::
               unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator->(&Into_local->SwitchValues);
      local_38._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar2);
      pvVar2 = std::
               unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator->(&Into_local->SwitchValues);
      local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar2);
      local_48 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                         insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                                   (this_00,local_28,local_38,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     )local_40);
    }
    else if (local_20->Condition != (Expression *)0x0) {
      __assert_fail("!Into->Condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                    ,0x3cf,
                    "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                   );
    }
  }
  else if (Into_local->Condition == (Expression *)0x0) {
    local_20->Condition = (Expression *)0x0;
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reset(&local_20->SwitchValues,(pointer)0x0);
  }
  else if (local_20->Condition != (Expression *)0x0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20->SwitchValues);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!Into->SwitchValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                    ,0x3df,
                    "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                   );
    }
    ::wasm::Builder::Builder(&local_50,((this->super_RelooperRecursor).Parent)->Module);
    pBVar3 = ::wasm::Builder::makeBinary
                       (&local_50,OrInt32,local_20->Condition,Into_local->Condition);
    local_20->Condition = (Expression *)pBVar3;
  }
  if (Into_local->Code != (Expression *)0x0) {
    if (local_20->Code == (Expression *)0x0) {
      local_20->Code = Into_local->Code;
    }
    else {
      bVar1 = IsCodeEquivalent(local_20->Code,Into_local->Code);
      if (!bVar1) {
        __assert_fail("IsCodeEquivalent(Into->Code, Curr->Code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/Relooper.cpp"
                      ,0x3ec,
                      "void CFG::(anonymous namespace)::Optimizer::MergeBranchInto(Branch *, Branch *)"
                     );
      }
    }
  }
  return;
}

Assistant:

void MergeBranchInto(Branch* Curr, Branch* Into) {
    assert(Curr != Into);
    if (Curr->SwitchValues) {
      if (!Into->SwitchValues) {
        assert(!Into->Condition);
        // Merging into the already-default, nothing to do.
      } else {
        Into->SwitchValues->insert(Into->SwitchValues->end(),
                                   Curr->SwitchValues->begin(),
                                   Curr->SwitchValues->end());
      }
    } else {
      if (!Curr->Condition) {
        // This is now the new default. Whether Into has a condition
        // or switch values, remove them all to make us the default.
        Into->Condition = nullptr;
        Into->SwitchValues.reset();
      } else if (!Into->Condition) {
        // Nothing to do, already the default.
      } else {
        assert(!Into->SwitchValues);
        // Merge them, checking both.
        Into->Condition =
          wasm::Builder(*Parent->Module)
            .makeBinary(wasm::OrInt32, Into->Condition, Curr->Condition);
      }
    }
    if (!Curr->Code) {
      // No code to merge in.
    } else if (!Into->Code) {
      // Just use the code being merged in.
      Into->Code = Curr->Code;
    } else {
      assert(IsCodeEquivalent(Into->Code, Curr->Code));
      // Keep the code already there, either is fine.
    }
  }